

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

size_t mp_get_nbits(mp_int *x)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if (x->nw == 0) {
    uVar3 = 0xffffffffffffffff;
    lVar2 = -0x3f;
  }
  else {
    sVar1 = 0xffffffffffffffff;
    sVar5 = 0;
    uVar3 = 0xffffffffffffffff;
    do {
      uVar6 = x->w[sVar5];
      if ((uVar6 & 1) != 0 || uVar6 >> 1 != 0) {
        sVar1 = sVar5;
        uVar3 = uVar6;
      }
      sVar5 = sVar5 + 1;
    } while (x->nw != sVar5);
    lVar2 = sVar1 * 0x40 + 1;
  }
  lVar4 = 0;
  uVar6 = 0x20;
  do {
    uVar7 = uVar3 >> (sbyte)uVar6;
    uVar8 = uVar7;
    if (uVar7 != 0) {
      uVar8 = uVar6;
      uVar3 = uVar7;
    }
    lVar4 = lVar4 + uVar8;
    bVar9 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar9);
  return lVar2 + lVar4;
}

Assistant:

size_t mp_get_nbits(mp_int *x)
{
    /* Sentinel values in case there are no bits set at all: we
     * imagine that there's a word at position -1 (i.e. the topmost
     * fraction word) which is all 1s, because that way, we handle a
     * zero input by considering its highest set bit to be the top one
     * of that word, i.e. just below the units digit, i.e. at bit
     * index -1, i.e. so we'll return 0 on output. */
    size_t hiword_index = -(size_t)1;
    uint64_t hiword64 = ~(BignumInt)0;

    /*
     * Find the highest nonzero word and its index.
     */
    mp_find_highest_nonzero_word_pair(x, 0, &hiword_index, &hiword64, NULL);
    BignumInt hiword = hiword64; /* in case BignumInt is a narrower type */

    /*
     * Find the index of the highest set bit within hiword.
     */
    BignumInt hibit_index = 0;
    for (size_t i = (1 << (BIGNUM_INT_BITS_BITS-1)); i != 0; i >>= 1) {
        BignumInt shifted_word = hiword >> i;
        BignumInt indicator =
            (BignumInt)(-shifted_word) >> (BIGNUM_INT_BITS-1);
        hiword ^= (shifted_word ^ hiword ) & -indicator;
        hibit_index += i & -(size_t)indicator;
    }

    /*
     * Put together the result.
     */
    return (hiword_index << BIGNUM_INT_BITS_BITS) + hibit_index + 1;
}